

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.cpp
# Opt level: O3

void __thiscall TestRunner::~TestRunner(TestRunner *this)

{
  ostream *poVar1;
  
  if (this->fail_count < 1) {
    return;
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->fail_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," unit tests failed. Terminate",0x1d);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

TestRunner::~TestRunner() {
    if (fail_count > 0) {
        std::cerr << fail_count << " unit tests failed. Terminate" << std::endl;
        exit(1);
    }
}